

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadImportSection(BinaryReader *this,Offset section_size)

{
  uint8_t uVar1;
  size_t sVar2;
  int iVar3;
  Result RVar4;
  undefined4 extraout_var;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t kind;
  string_view field_name;
  uint32_t page_size;
  Index IStack_7c;
  uint32_t value;
  Index IStack_74;
  undefined7 uStack_70;
  undefined4 uStack_69;
  uint local_58;
  Index num_imports;
  ulong local_50;
  string_view module_name;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])();
  if (iVar3 == 0) {
    RVar4 = ReadCount(this,&num_imports,"import count");
    if (RVar4.enum_ != Error) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x10])
                        (this->delegate_,(ulong)num_imports);
      if (iVar3 == 0) {
        if (num_imports != 0) {
          uVar7 = 0;
          local_58 = num_imports;
          local_50 = CONCAT44(extraout_var,iVar3);
          do {
            module_name._M_len = 0;
            module_name._M_str = (char *)0x0;
            RVar4 = ReadStr(this,&module_name,"import module name");
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            field_name._M_len = 0;
            field_name._M_str = (char *)0x0;
            RVar4 = ReadStr(this,&field_name,"import field name");
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            RVar4 = ReadU8(this,&kind,"import kind");
            pcVar5 = module_name._M_str;
            sVar2 = module_name._M_len;
            uVar1 = kind;
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x11])
                              (this->delegate_,uVar7,(ulong)kind,module_name._M_len,
                               module_name._M_str);
            if (iVar3 != 0) {
              pcVar5 = "OnImport callback failed";
              goto LAB_00180577;
            }
            switch((uint)uVar1) {
            case 0:
              RVar4 = ReadU32Leb128(this,&value,"import signature index");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              local_50 = (ulong)_value & 0xffffffff;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x12])
                                (this->delegate_,uVar7,sVar2,pcVar5,field_name._M_len,
                                 field_name._M_str,(ulong)this->num_func_imports_,local_50);
              if (iVar3 != 0) {
                pcVar5 = "OnImportFunc callback failed";
                goto LAB_00180577;
              }
              this->num_func_imports_ = this->num_func_imports_ + 1;
              break;
            case 1:
              value = Any;
              IStack_74 = 0;
              uStack_70 = 0;
              uStack_69 = 0;
              RVar4 = ReadTable(this,(Type *)&page_size,(Limits *)&value);
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x13])
                                (this->delegate_,uVar7,sVar2,pcVar5,field_name._M_len,
                                 field_name._M_str,(ulong)this->num_table_imports_,
                                 CONCAT44(IStack_7c,page_size),(Limits *)&value);
              if (iVar3 != 0) {
                pcVar5 = "OnImportTable callback failed";
                goto LAB_00180577;
              }
              this->num_table_imports_ = this->num_table_imports_ + 1;
              break;
            case 2:
              value = Any;
              IStack_74 = 0;
              uStack_70 = 0;
              uStack_69 = 0;
              RVar4 = ReadMemory(this,(Limits *)&value,&page_size);
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x14])
                                (this->delegate_,uVar7,sVar2,pcVar5,field_name._M_len,
                                 field_name._M_str,(ulong)this->num_memory_imports_,(Limits *)&value
                                 ,(ulong)page_size);
              if (iVar3 != 0) {
                pcVar5 = "OnImportMemory callback failed";
                goto LAB_00180577;
              }
              this->num_memory_imports_ = this->num_memory_imports_ + 1;
              break;
            case 3:
              RVar4 = ReadGlobalHeader(this,(Type *)&value,(bool *)&page_size);
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x15])
                                (this->delegate_,uVar7,sVar2,pcVar5,field_name._M_len,
                                 field_name._M_str,(ulong)this->num_global_imports_,_value,
                                 (ulong)(byte)page_size);
              if (iVar3 != 0) {
                pcVar5 = "OnImportGlobal callback failed";
                goto LAB_00180577;
              }
              this->num_global_imports_ = this->num_global_imports_ + 1;
              break;
            case 4:
              if ((this->options_->features).exceptions_enabled_ == false) {
                pcVar5 = "invalid import tag kind: exceptions not allowed";
                goto LAB_00180577;
              }
              RVar4 = ReadTagType(this,&value);
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x16])
                                (this->delegate_,uVar7,sVar2,pcVar5,field_name._M_len,
                                 field_name._M_str,(ulong)this->num_tag_imports_,
                                 (ulong)_value & 0xffffffff);
              if (iVar3 != 0) {
                pcVar5 = "OnImportTag callback failed";
                goto LAB_00180577;
              }
              this->num_tag_imports_ = this->num_tag_imports_ + 1;
              break;
            default:
              PrintError(this,"malformed import kind: %d",(ulong)(uint)uVar1);
              return (Result)Error;
            }
            uVar6 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar6;
          } while (local_58 != uVar6);
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x17])();
        if (iVar3 == 0) {
          return (Result)Ok;
        }
        pcVar5 = "EndImportSection callback failed";
      }
      else {
        pcVar5 = "OnImportCount callback failed";
      }
LAB_00180577:
      PrintError(this,pcVar5);
    }
  }
  else {
    PrintError(this,"BeginImportSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadImportSection(Offset section_size) {
  CALLBACK(BeginImportSection, section_size);
  Index num_imports;
  CHECK_RESULT(ReadCount(&num_imports, "import count"));
  CALLBACK(OnImportCount, num_imports);
  for (Index i = 0; i < num_imports; ++i) {
    std::string_view module_name;
    CHECK_RESULT(ReadStr(&module_name, "import module name"));
    std::string_view field_name;
    CHECK_RESULT(ReadStr(&field_name, "import field name"));

    uint8_t kind;
    CHECK_RESULT(ReadU8(&kind, "import kind"));
    CALLBACK(OnImport, i, static_cast<ExternalKind>(kind), module_name,
             field_name);
    switch (static_cast<ExternalKind>(kind)) {
      case ExternalKind::Func: {
        Index sig_index;
        CHECK_RESULT(ReadIndex(&sig_index, "import signature index"));
        CALLBACK(OnImportFunc, i, module_name, field_name, num_func_imports_,
                 sig_index);
        num_func_imports_++;
        break;
      }

      case ExternalKind::Table: {
        Type elem_type;
        Limits elem_limits;
        CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
        CALLBACK(OnImportTable, i, module_name, field_name, num_table_imports_,
                 elem_type, &elem_limits);
        num_table_imports_++;
        break;
      }

      case ExternalKind::Memory: {
        Limits page_limits;
        uint32_t page_size;
        CHECK_RESULT(ReadMemory(&page_limits, &page_size));
        CALLBACK(OnImportMemory, i, module_name, field_name,
                 num_memory_imports_, &page_limits, page_size);
        num_memory_imports_++;
        break;
      }

      case ExternalKind::Global: {
        Type type;
        bool mutable_;
        CHECK_RESULT(ReadGlobalHeader(&type, &mutable_));
        CALLBACK(OnImportGlobal, i, module_name, field_name,
                 num_global_imports_, type, mutable_);
        num_global_imports_++;
        break;
      }

      case ExternalKind::Tag: {
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid import tag kind: exceptions not allowed");
        Index sig_index;
        CHECK_RESULT(ReadTagType(&sig_index));
        CALLBACK(OnImportTag, i, module_name, field_name, num_tag_imports_,
                 sig_index);
        num_tag_imports_++;
        break;
      }

      default:
        PrintError("malformed import kind: %d", kind);
        return Result::Error;
    }
  }

  CALLBACK0(EndImportSection);
  return Result::Ok;
}